

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_option_text(nk_context *ctx,char *text,int len,int is_active)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_widget_layout_states nVar3;
  nk_context *in;
  int is_active_local;
  nk_rect bounds;
  
  is_active_local = is_active;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4fb3,"int nk_option_text(struct nk_context *, const char *, int, int)");
  }
  pnVar1 = ctx->current;
  if (pnVar1 != (nk_window *)0x0) {
    pnVar2 = pnVar1->layout;
    if (pnVar2 != (nk_panel *)0x0) {
      nVar3 = nk_widget(&bounds,ctx);
      if (nVar3 != NK_WIDGET_INVALID) {
        if (nVar3 == NK_WIDGET_ROM) {
          in = (nk_context *)0x0;
        }
        else {
          in = (nk_context *)0x0;
          if ((pnVar2->flags & 0x1000) == 0) {
            in = ctx;
          }
        }
        nk_do_toggle(&ctx->last_widget_state,&pnVar1->buffer,bounds,&is_active_local,text,len,
                     NK_TOGGLE_OPTION,&(ctx->style).option,&in->input,(ctx->style).font);
        nVar3 = is_active_local;
      }
      return nVar3;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4fb5,"int nk_option_text(struct nk_context *, const char *, int, int)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x4fb4,"int nk_option_text(struct nk_context *, const char *, int, int)");
}

Assistant:

NK_API int
nk_option_text(struct nk_context *ctx, const char *text, int len, int is_active)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;
    const struct nk_style *style;

    struct nk_rect bounds;
    enum nk_widget_layout_states state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return is_active;

    win = ctx->current;
    style = &ctx->style;
    layout = win->layout;

    state = nk_widget(&bounds, ctx);
    if (!state) return (int)state;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    nk_do_toggle(&ctx->last_widget_state, &win->buffer, bounds, &is_active,
        text, len, NK_TOGGLE_OPTION, &style->option, in, style->font);
    return is_active;
}